

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

size_t utf8_ptr::to_wcharz(wchar_t *buf,size_t bufcnt,char *str,size_t len)

{
  size_t in_RCX;
  char *in_RDX;
  size_t in_RSI;
  wchar_t *in_RDI;
  size_t cnt;
  size_t local_8;
  
  if (in_RSI == 0) {
    local_8 = to_wchar(in_RDI,0,in_RDX,in_RCX);
  }
  else {
    local_8 = to_wchar(in_RDI,in_RSI,in_RDX,in_RCX);
    in_RDI[in_RSI - 1] = L'\0';
  }
  return local_8;
}

Assistant:

static size_t to_wcharz(wchar_t *buf, size_t bufcnt, const char *str,
                            size_t len)
    {
        /* we need at least one character for null termination */
        if (bufcnt > 0)
        {
            /* convert the string, reserving space for a null */
            size_t cnt = to_wchar(buf, bufcnt - 1, str, len);

            /* add the null termination */
            buf[bufcnt-1] = 0;

            /* return the character count */
            return cnt;
        }
        else
        {
            /* 
             *   the output buffer is zero length, so we can't convert
             *   anything and can't null terminate; just calculate the length
             */
            return to_wchar(buf, bufcnt, str, len);
        }
    }